

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O0

void compress_DDS_alpha_block(uchar *uncompressed,uchar *compressed)

{
  int iVar1;
  int iVar2;
  int value;
  int svalue;
  int swizzle8 [8];
  float local_28;
  float scale_me;
  int a1;
  int a0;
  int next_bit;
  int i;
  uchar *compressed_local;
  uchar *uncompressed_local;
  
  _value = 0x700000001;
  swizzle8[0] = 6;
  swizzle8[1] = 5;
  swizzle8[2] = 4;
  swizzle8[3] = 3;
  swizzle8[4] = 2;
  swizzle8[5] = 0;
  local_28 = (float)(uint)uncompressed[3];
  scale_me = local_28;
  for (a0 = 7; a0 < 0x40; a0 = a0 + 4) {
    if ((uint)scale_me < (uint)uncompressed[a0]) {
      scale_me = (float)(uint)uncompressed[a0];
    }
    else if ((uint)uncompressed[a0] < (uint)local_28) {
      local_28 = (float)(uint)uncompressed[a0];
    }
  }
  *compressed = SUB41(scale_me,0);
  compressed[1] = SUB41(local_28,0);
  compressed[2] = '\0';
  compressed[3] = '\0';
  compressed[4] = '\0';
  compressed[5] = '\0';
  compressed[6] = '\0';
  compressed[7] = '\0';
  a1 = 0x10;
  for (a0 = 3; a0 < 0x40; a0 = a0 + 4) {
    iVar1 = (&value)[(int)((int)((float)(int)((uint)uncompressed[a0] - (int)local_28) *
                                (7.9999 / (float)((int)scale_me - (int)local_28))) & 7)];
    iVar2 = a1 >> 3;
    compressed[iVar2] = compressed[iVar2] | (byte)(iVar1 << ((byte)a1 & 7));
    if (5 < (a1 & 7U)) {
      compressed[iVar2 + 1] = compressed[iVar2 + 1] | (byte)(iVar1 >> (8 - ((byte)a1 & 7) & 0x1f));
    }
    a1 = a1 + 3;
  }
  return;
}

Assistant:

void
	compress_DDS_alpha_block
	(
		const unsigned char *const uncompressed,
		unsigned char compressed[8]
	)
{
	/*	variables	*/
	int i;
	int next_bit;
	int a0, a1;
	float scale_me;
	/*	stupid order	*/
	int swizzle8[] = { 1, 7, 6, 5, 4, 3, 2, 0 };
	/*	get the alpha limits (a0 > a1)	*/
	a0 = a1 = uncompressed[3];
	for( i = 4+3; i < 16*4; i += 4 )
	{
		if( uncompressed[i] > a0 )
		{
			a0 = uncompressed[i];
		} else if( uncompressed[i] < a1 )
		{
			a1 = uncompressed[i];
		}
	}
	/*	store those limits, and zero the rest of the compressed dataset	*/
	compressed[0] = a0;
	compressed[1] = a1;
	/*	zero out the compressed data	*/
	compressed[2] = 0;
	compressed[3] = 0;
	compressed[4] = 0;
	compressed[5] = 0;
	compressed[6] = 0;
	compressed[7] = 0;
	/*	store the all of the alpha values	*/
	next_bit = 8*2;
	scale_me = 7.9999f / (a0 - a1);
	for( i = 3; i < 16*4; i += 4 )
	{
		/*	convert this alpha value to a 3 bit number	*/
		int svalue;
		int value = (int)((uncompressed[i] - a1) * scale_me);
		svalue = swizzle8[ value&7 ];
		/*	OK, store this value, start with the 1st byte	*/
		compressed[next_bit >> 3] |= svalue << (next_bit & 7);
		if( (next_bit & 7) > 5 )
		{
			/*	spans 2 bytes, fill in the start of the 2nd byte	*/
			compressed[1 + (next_bit >> 3)] |= svalue >> (8 - (next_bit & 7) );
		}
		next_bit += 3;
	}
	/*	done compressing to DXT1	*/
}